

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O1

int32 hmm_vit_eval_anytopo(hmm_t *hmm)

{
  hmm_state_t *phVar1;
  uint8 uVar2;
  hmm_context_t *phVar3;
  int32 *piVar4;
  bool bVar5;
  hmm_state_t *phVar6;
  int iVar7;
  int iVar8;
  anon_union_8_2_a763b4f7_for_s *paVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int32 iVar15;
  anon_union_8_2_a763b4f7_for_s *paVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  
  uVar2 = hmm->mpx;
  paVar9 = &hmm->s;
  if (uVar2 != '\0') {
    paVar9 = (anon_union_8_2_a763b4f7_for_s *)paVar9->mpx_ssid;
  }
  phVar3 = hmm->ctx;
  if (paVar9->ssid == -1) {
    iVar15 = -0x38000000;
  }
  else {
    paVar9 = &hmm->s;
    if (uVar2 != '\0') {
      paVar9 = (anon_union_8_2_a763b4f7_for_s *)paVar9->mpx_ssid;
    }
    if (paVar9->ssid == -1) {
      lVar10 = -1;
    }
    else {
      paVar9 = &hmm->s;
      if (uVar2 != '\0') {
        paVar9 = (anon_union_8_2_a763b4f7_for_s *)paVar9->mpx_ssid;
      }
      lVar10 = (long)*phVar3->sseq[paVar9->ssid];
    }
    iVar15 = phVar3->senscore[lVar10];
  }
  phVar1 = hmm->state;
  piVar4 = phVar3->st_sen_scr;
  *piVar4 = iVar15 + hmm->state[0].score;
  uVar12 = (ulong)hmm->n_emit_state;
  if (1 < hmm->n_emit_state) {
    paVar9 = &hmm->s;
    uVar11 = 1;
    do {
      paVar16 = paVar9;
      if (uVar2 != '\0') {
        paVar16 = (anon_union_8_2_a763b4f7_for_s *)((hmm->s).mpx_ssid + uVar11);
      }
      if (paVar16->ssid == -1) {
        iVar15 = -0x38000000;
      }
      else {
        paVar16 = paVar9;
        if (uVar2 != '\0') {
          paVar16 = (anon_union_8_2_a763b4f7_for_s *)((hmm->s).mpx_ssid + uVar11);
        }
        if (paVar16->ssid == -1) {
          lVar10 = -1;
        }
        else {
          paVar16 = paVar9;
          if (uVar2 != '\0') {
            paVar16 = (anon_union_8_2_a763b4f7_for_s *)((hmm->s).mpx_ssid + uVar11);
          }
          lVar10 = (long)phVar3->sseq[paVar16->ssid][uVar11];
        }
        iVar15 = phVar3->senscore[lVar10];
      }
      iVar15 = iVar15 + phVar1[uVar11].score;
      if (iVar15 < -0x37ffffff) {
        iVar15 = -0x38000000;
      }
      piVar4[uVar11] = iVar15;
      uVar11 = uVar11 + 1;
      uVar12 = (ulong)hmm->n_emit_state;
    } while (uVar11 < uVar12);
  }
  uVar14 = (int)uVar12 - 1;
  uVar11 = (ulong)uVar14;
  if ((char)uVar12 == '\0') {
    iVar7 = -0x38000000;
    uVar18 = 0xffffffff;
  }
  else {
    uVar18 = 0xffffffff;
    iVar7 = -0x38000000;
    lVar10 = uVar11 + 1;
    do {
      if ((-0x38000000 < phVar3->tp[hmm->tmatid][lVar10 + -1][uVar12]) &&
         (iVar8 = phVar3->tp[hmm->tmatid][lVar10 + -1][uVar12] + piVar4[lVar10 + -1], iVar7 < iVar8)
         ) {
        iVar7 = iVar8;
        uVar18 = uVar14;
      }
      uVar14 = uVar14 - 1;
      lVar19 = lVar10 + -1;
      bVar5 = 0 < lVar10;
      lVar10 = lVar19;
    } while (lVar19 != 0 && bVar5);
  }
  (hmm->out).score = iVar7;
  if (-1 < (int)uVar18) {
    (hmm->out).history = hmm->state[uVar18].history;
  }
  if ((int)uVar12 != 0) {
    uVar17 = uVar11;
    do {
      uVar11 = uVar11 - 1;
      iVar8 = phVar3->tp[hmm->tmatid][uVar17][uVar17];
      iVar13 = -0x38000000;
      if (-0x38000000 < iVar8) {
        iVar13 = iVar8 + phVar3->st_sen_scr[uVar17];
      }
      uVar14 = 0xffffffff;
      iVar8 = (int)uVar12;
      uVar21 = uVar11;
      if (0 < (long)uVar17) {
        do {
          iVar20 = phVar3->tp[hmm->tmatid][uVar21 & 0xffffffff][uVar17];
          if (-0x38000000 < iVar20) {
            iVar20 = iVar20 + phVar3->st_sen_scr[uVar21 & 0xffffffff];
            if (iVar13 < iVar20) {
              iVar13 = iVar20;
              uVar14 = (int)uVar12 - 2;
            }
          }
          uVar18 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar18;
          uVar21 = uVar21 - 1;
        } while (1 < (int)uVar18);
      }
      if (uVar17 == 0) {
        phVar1->score = iVar13;
        phVar6 = hmm->state;
        if (-1 < (int)uVar14) {
LAB_0010fcae:
          phVar6->history = hmm->state[uVar14].history;
        }
      }
      else {
        phVar1[uVar17].score = iVar13;
        if (-1 < (int)uVar14) {
          phVar6 = phVar1 + uVar17;
          goto LAB_0010fcae;
        }
      }
      if ((uVar2 != '\0') && (-1 < (int)uVar14)) {
        (hmm->s).mpx_ssid[uVar17] = (hmm->s).mpx_ssid[uVar14];
      }
      if (iVar7 <= iVar13) {
        iVar7 = iVar13;
      }
      uVar12 = (ulong)(iVar8 - 1);
      bVar5 = 0 < (long)uVar17;
      uVar17 = uVar17 - 1;
    } while (bVar5);
  }
  hmm->bestscore = iVar7;
  return iVar7;
}

Assistant:

static int32
hmm_vit_eval_anytopo(hmm_t * hmm)
{
    hmm_context_t *ctx = hmm->ctx;
    int32 to, from, bestfrom;
    int32 newscr, scr, bestscr;
    int final_state;

    /* Compute previous state-score + observation output prob for each emitting state */
    ctx->st_sen_scr[0] = hmm_in_score(hmm) + hmm_senscr(hmm, 0);
    for (from = 1; from < hmm_n_emit_state(hmm); ++from) {
        if ((ctx->st_sen_scr[from] =
             hmm_score(hmm, from) + hmm_senscr(hmm, from)) < WORST_SCORE)
            ctx->st_sen_scr[from] = WORST_SCORE;
    }

    /* FIXME/TODO: Use the BLAS for all this. */
    /* Evaluate final-state first, which does not have a self-transition */
    final_state = hmm_n_emit_state(hmm);
    to = final_state;
    scr = WORST_SCORE;
    bestfrom = -1;
    for (from = to - 1; from >= 0; --from) {
        if ((hmm_tprob(hmm, from, to) > WORST_SCORE) &&
            ((newscr = ctx->st_sen_scr[from]
              + hmm_tprob(hmm, from, to)) > scr)) {
            scr = newscr;
            bestfrom = from;
        }
    }
    hmm_out_score(hmm) = scr;
    if (bestfrom >= 0)
        hmm_out_history(hmm) = hmm_history(hmm, bestfrom);
    bestscr = scr;

    /* Evaluate all other states, which might have self-transitions */
    for (to = final_state - 1; to >= 0; --to) {
        /* Score from self-transition, if any */
        scr =
            (hmm_tprob(hmm, to, to) > WORST_SCORE)
            ? ctx->st_sen_scr[to] + hmm_tprob(hmm, to, to)
            : WORST_SCORE;

        /* Scores from transitions from other states */
        bestfrom = -1;
        for (from = to - 1; from >= 0; --from) {
            if ((hmm_tprob(hmm, from, to) > WORST_SCORE) &&
                ((newscr = ctx->st_sen_scr[from]
                  + hmm_tprob(hmm, from, to)) > scr)) {
                scr = newscr;
                bestfrom = from;
            }
        }

        /* Update new result for state to */
        if (to == 0) {
            hmm_in_score(hmm) = scr;
            if (bestfrom >= 0)
                hmm_in_history(hmm) = hmm_history(hmm, bestfrom);
        }
        else {
            hmm_score(hmm, to) = scr;
            if (bestfrom >= 0)
                hmm_history(hmm, to) = hmm_history(hmm, bestfrom);
        }
        if (bestfrom >= 0 && hmm_is_mpx(hmm))
            hmm->s.mpx_ssid[to] = hmm->s.mpx_ssid[bestfrom];

        if (bestscr < scr)
            bestscr = scr;
    }

    hmm_bestscore(hmm) = bestscr;
    return bestscr;
}